

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O0

iterator * __thiscall pybind11::detail::values_and_holders::iterator::operator++(iterator *this)

{
  ulong uVar1;
  const_reference pptVar2;
  size_type sVar3;
  iterator *in_RDI;
  value_type local_20;
  
  if (((byte)in_RDI->inst->field_0x30 >> 1 & 1) == 0) {
    pptVar2 = std::
              vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
              ::operator[](in_RDI->types,(in_RDI->curr).index);
    (in_RDI->curr).vh = (in_RDI->curr).vh + (*pptVar2)->holder_size_in_ptrs + 1;
  }
  (in_RDI->curr).index = (in_RDI->curr).index + 1;
  uVar1 = (in_RDI->curr).index;
  sVar3 = std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
          ::size(in_RDI->types);
  if (uVar1 < sVar3) {
    pptVar2 = std::
              vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
              ::operator[](in_RDI->types,(in_RDI->curr).index);
    local_20 = *pptVar2;
  }
  else {
    local_20 = (value_type)0x0;
  }
  (in_RDI->curr).type = local_20;
  return in_RDI;
}

Assistant:

iterator &operator++() {
            if (!inst->simple_layout) {
                curr.vh += 1 + (*types)[curr.index]->holder_size_in_ptrs;
            }
            ++curr.index;
            curr.type = curr.index < types->size() ? (*types)[curr.index] : nullptr;
            return *this;
        }